

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void __thiscall LogToCallbackRedirector::~LogToCallbackRedirector(LogToCallbackRedirector *this)

{
  undefined8 *puVar1;
  
  (this->super_LogStream)._vptr_LogStream = (_func_int **)&PTR__LogToCallbackRedirector_00908ce0;
  puVar1 = Assimp::gPredefinedStreams_abi_cxx11_;
  if ((undefined8 **)Assimp::gPredefinedStreams_abi_cxx11_ != &Assimp::gPredefinedStreams_abi_cxx11_
     ) {
    do {
      if ((char *)puVar1[2] == (this->stream).user) break;
      puVar1 = (undefined8 *)*puVar1;
    } while ((undefined8 **)puVar1 != &Assimp::gPredefinedStreams_abi_cxx11_);
  }
  if ((undefined8 **)puVar1 != &Assimp::gPredefinedStreams_abi_cxx11_) {
    if ((long *)puVar1[2] != (long *)0x0) {
      (**(code **)(*(long *)puVar1[2] + 8))();
    }
    _DAT_009e0e38 = _DAT_009e0e38 + -1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

~LogToCallbackRedirector()  {
#ifndef ASSIMP_BUILD_SINGLETHREADED
        std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
        // (HACK) Check whether the 'stream.user' pointer points to a
        // custom LogStream allocated by #aiGetPredefinedLogStream.
        // In this case, we need to delete it, too. Of course, this
        // might cause strange problems, but the chance is quite low.

        PredefLogStreamMap::iterator it = std::find(gPredefinedStreams.begin(),
            gPredefinedStreams.end(), (Assimp::LogStream*)stream.user);

        if (it != gPredefinedStreams.end()) {
            delete *it;
            gPredefinedStreams.erase(it);
        }
    }